

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hole.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int decompress;
  int compress;
  int err;
  int c;
  zip_source_t *to;
  zip_source_t *from;
  char **argv_local;
  int argc_local;
  
  bVar2 = true;
  bVar1 = false;
  progname = *argv;
  while (iVar3 = getopt(argc,argv,"du"), iVar3 != -1) {
    if (iVar3 == 100) {
      bVar2 = false;
      bVar1 = true;
    }
    else if (iVar3 == 0x75) {
      bVar2 = true;
      bVar1 = true;
    }
    else {
      usage();
    }
  }
  if (_optind + 2 != argc) {
    usage();
  }
  if (bVar1) {
    to = open_compressed(argv[_optind],0);
  }
  else {
    to = open_file(argv[_optind]);
  }
  if (bVar2) {
    _err = open_compressed(argv[_optind + 1],1);
  }
  else {
    _err = open_file(argv[_optind + 1]);
  }
  iVar3 = copy_source(to,_err);
  zip_source_free(to);
  zip_source_free();
  exit((uint)(iVar3 < 0));
}

Assistant:

int
main(int argc, char **argv) {
    zip_source_t *from;
    zip_source_t *to;
    int c, err;
    int compress = 1;
    int decompress = 0;

    progname = argv[0];

    while ((c = getopt(argc, argv, "du")) != -1) {
	switch (c) {
	case 'd':
	    compress = 0;
	    decompress = 1;
	    break;

	case 'u':
	    compress = 1;
	    decompress = 1;
	    break;

	default:
	    usage();
	    break;
	}
    }

    if (optind + 2 != argc) {
	usage();
    }

    if (decompress) {
	from = open_compressed(argv[optind], 0);
    }
    else {
	from = open_file(argv[optind]);
    }

    if (compress) {
	to = open_compressed(argv[optind + 1], ZIP_CREATE);
    }
    else {
	to = open_file(argv[optind + 1]);
    }

    err = copy_source(from, to);

    zip_source_free(from);
    zip_source_free(to);

    exit(err < 0 ? 1 : 0);
}